

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O1

trt_node * troc_read_node(trt_node *__return_storage_ptr__,trt_parent_cache ca,trt_tree_ctx *tc)

{
  ushort uVar1;
  ushort uVar2;
  lysc_node *node;
  lys_module *plVar3;
  lysp_node *pn;
  trt_iffeatures_type tVar4;
  lyplg_ext_sprinter_tree_node_override *plVar5;
  void *pvVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  trt_type tVar10;
  
  if ((tc == (trt_tree_ctx *)0x0) || (tc->cn == (lysc_node *)0x0)) {
    __assert_fail("tc && tc->cn",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                  ,0xcf3,
                  "struct trt_node troc_read_node(struct trt_parent_cache, struct trt_tree_ctx *)");
  }
  plVar5 = tro_set_node_overr(tc->lysc_tree,tc->cn,'\x01',&tc->plugin_ctx);
  node = tc->cn;
  __return_storage_ptr__->status = (char *)0x0;
  __return_storage_ptr__->flags = (char *)0x0;
  (__return_storage_ptr__->name).type = TRD_NODE_ELSE;
  (__return_storage_ptr__->name).keys = '\0';
  *(undefined3 *)&(__return_storage_ptr__->name).field_0x5 = 0;
  (__return_storage_ptr__->name).module_prefix = (char *)0x0;
  (__return_storage_ptr__->name).str = (char *)0x0;
  (__return_storage_ptr__->name).add_opts = (char *)0x0;
  (__return_storage_ptr__->name).opts = (char *)0x0;
  (__return_storage_ptr__->type).type = TRD_TYPE_EMPTY;
  (__return_storage_ptr__->type).str = (char *)0x0;
  (__return_storage_ptr__->iffeatures).type = TRD_IFF_NON_PRESENT;
  (__return_storage_ptr__->iffeatures).str = (char *)0x0;
  __return_storage_ptr__->last_one = '\x01';
  uVar1 = node->flags;
  pcVar7 = "x";
  if ((uVar1 & 8) == 0) {
    pcVar7 = "+";
  }
  pcVar8 = "o";
  if ((uVar1 & 0x10) == 0) {
    pcVar8 = pcVar7;
  }
  __return_storage_ptr__->status = pcVar8;
  uVar2 = node->nodetype;
  if ((plVar5 == (lyplg_ext_sprinter_tree_node_override *)0x0) ||
     (pcVar7 = plVar5->flags, plVar5->flags == (char *)0x0)) {
    if (((uVar2 | uVar1) >> 0xc & 1) == 0) {
      if ((uVar2 & 0x6000) == 0 && (uVar1 & 0x2000) == 0) {
        if ((uVar2 >> 10 & 1) == 0) {
          if ((uVar2 >> 0xb & 1) == 0) {
            if ((uVar2 & 0x300) == 0) {
              pcVar8 = "rw";
              if ((uVar1 & 1) == 0) {
                pcVar8 = "--";
              }
              pcVar7 = "ro";
              if ((uVar1 & 2) == 0) {
                pcVar7 = pcVar8;
              }
            }
            else {
              pcVar7 = "-x";
            }
          }
          else {
            pcVar7 = "-u";
          }
        }
        else {
          pcVar7 = "-n";
        }
      }
      else {
        pcVar7 = "ro";
      }
    }
    else {
      pcVar7 = "-w";
    }
  }
  __return_storage_ptr__->flags = pcVar7;
  if ((uVar2 & 0x3000) != 0) {
LAB_0019abd4:
    (__return_storage_ptr__->name).type = TRD_NODE_ELSE;
    goto LAB_0019ac10;
  }
  if ((char)uVar2 < '\0') {
    (__return_storage_ptr__->name).type = TRD_NODE_CASE;
    goto LAB_0019ac10;
  }
  if (((uVar1 & 0x20) == 0) && ((uVar2 & 2) != 0)) {
    (__return_storage_ptr__->name).type = TRD_NODE_CHOICE;
LAB_0019abfc:
    pcVar7 = "?";
  }
  else {
    if ((uVar2 & 2) != 0) {
      (__return_storage_ptr__->name).type = TRD_NODE_CHOICE;
      goto LAB_0019ac10;
    }
    if (((char)uVar1 < '\0') && ((uVar2 & 1) != 0)) {
      pcVar7 = "!";
    }
    else {
      if ((uVar2 & 0x18) == 0) {
        if ((((uVar1 & 0x20) != 0) || ((uVar2 & 0x60) == 0)) &&
           (((uVar1 & 0x120) != 0 || ((uVar2 & 4) == 0)))) goto LAB_0019abd4;
        goto LAB_0019abfc;
      }
      pcVar7 = "*";
    }
  }
  (__return_storage_ptr__->name).opts = pcVar7;
LAB_0019ac10:
  if (plVar5 == (lyplg_ext_sprinter_tree_node_override *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = plVar5->add_opts;
  }
  (__return_storage_ptr__->name).add_opts = pcVar7;
  if ((node->nodetype & 0x10) == 0) {
    bVar9 = false;
  }
  else {
    bVar9 = (node->flags & 0x200) == 0;
  }
  (__return_storage_ptr__->name).keys = bVar9;
  plVar3 = node->module;
  if ((tc->cmod == (lysc_module *)0x0 || plVar3 == (lys_module *)0x0) ||
     (plVar3->compiled == tc->cmod)) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = plVar3->prefix;
  }
  (__return_storage_ptr__->name).module_prefix = pcVar7;
  (__return_storage_ptr__->name).str = node->name;
  pn = (lysp_node *)node->priv;
  tVar10 = trop_resolve_type(pn);
  (__return_storage_ptr__->type).type = tVar10.type;
  (__return_storage_ptr__->type).str = tVar10.str;
  if (((pn == (lysp_node *)0x0) || (pn->iffeatures == (lysp_qname *)0x0)) ||
     (tVar4 = TRD_IFF_PRESENT, *(long *)&pn->iffeatures[-1].flags == 0)) {
    tVar4 = TRD_IFF_NON_PRESENT;
  }
  (__return_storage_ptr__->iffeatures).type = tVar4;
  (__return_storage_ptr__->iffeatures).str = (char *)0x0;
  pvVar6 = tro_next_sibling(node,tc);
  __return_storage_ptr__->last_one = pvVar6 == (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

static struct trt_node
troc_read_node(struct trt_parent_cache ca, struct trt_tree_ctx *tc)
{
    (void) ca;
    const struct lysc_node *cn;
    struct trt_node ret;
    struct lyplg_ext_sprinter_tree_node_override *no;

    assert(tc && tc->cn);

    no = tro_set_node_overr(tc->lysc_tree, tc->cn, 1, &tc->plugin_ctx);

    cn = tc->cn;
    ret = TRP_EMPTY_NODE;

    /* <status> */
    ret.status = tro_flags2status(cn->flags);

    /* <flags> */
    ret.flags = troc_resolve_flags(cn->nodetype, cn->flags, no);

    /* set type of the node */
    troc_resolve_node_opts(cn->nodetype, cn->flags, &ret.name.type, &ret.name.opts);
    ret.name.add_opts = no && no->add_opts ? no->add_opts : NULL;
    ret.name.keys = (cn->nodetype & LYS_LIST) && !(cn->flags & LYS_KEYLESS);

    /* <prefix> */
    ret.name.module_prefix = troc_resolve_node_prefix(cn, tc->cmod);

    /* set node's name */
    ret.name.str = cn->name;

    /* <type> */
    ret.type = trop_resolve_type(TRP_TREE_CTX_GET_LYSP_NODE(cn));

    /* <iffeature> */
    ret.iffeatures = trop_resolve_iffeatures(TRP_TREE_CTX_GET_LYSP_NODE(cn));

    ret.last_one = !tro_next_sibling(cn, tc);

    return ret;
}